

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O3

void __thiscall Assimp::MD3Importer::ValidateHeaderOffsets(MD3Importer *this)

{
  uint uVar1;
  uint uVar2;
  Logger *this_00;
  Header *pHVar3;
  runtime_error *prVar4;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pHVar3 = this->pcHeader;
  if ((pHVar3->IDENT != 0x33504449) && (pHVar3->IDENT != 0x49445033)) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"Invalid MD3 file: Magic bytes not found","");
    std::runtime_error::runtime_error(prVar4,(string *)local_40);
    *(undefined ***)prVar4 = &PTR__runtime_error_007fc4b8;
    __cxa_throw(prVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (0xf < pHVar3->VERSION) {
    this_00 = DefaultLogger::get();
    Logger::warn(this_00,"Unsupported MD3 file version. Continuing happily ...");
    pHVar3 = this->pcHeader;
  }
  uVar1 = pHVar3->NUM_SURFACES;
  if ((ulong)uVar1 == 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"Invalid md3 file: NUM_SURFACES is 0","");
    std::runtime_error::runtime_error(prVar4,(string *)local_40);
    *(undefined ***)prVar4 = &PTR__runtime_error_007fc4b8;
    __cxa_throw(prVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar2 = this->fileSize;
  if (((uVar2 <= pHVar3->OFS_FRAMES) || (uVar2 <= pHVar3->OFS_SURFACES)) ||
     (uVar2 < pHVar3->OFS_EOF)) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"Invalid MD3 header: some offsets are outside the file","");
    std::runtime_error::runtime_error(prVar4,(string *)local_40);
    *(undefined ***)prVar4 = &PTR__runtime_error_007fc4b8;
    __cxa_throw(prVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (0x25ed09 < uVar1) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"Invalid MD3 header: too many surfaces, would overflow","");
    std::runtime_error::runtime_error(prVar4,(string *)local_40);
    *(undefined ***)prVar4 = &PTR__runtime_error_007fc4b8;
    __cxa_throw(prVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((ulong)pHVar3->OFS_SURFACES + (ulong)uVar1 * 0x6c < (ulong)uVar2) {
    if (this->configFrameID < pHVar3->NUM_FRAMES) {
      return;
    }
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"The requested frame is not existing the file","");
    std::runtime_error::runtime_error(prVar4,(string *)local_40);
    *(undefined ***)prVar4 = &PTR__runtime_error_007fc4b8;
    __cxa_throw(prVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Invalid MD3 header: some surfaces are outside the file","");
  std::runtime_error::runtime_error(prVar4,(string *)local_40);
  *(undefined ***)prVar4 = &PTR__runtime_error_007fc4b8;
  __cxa_throw(prVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MD3Importer::ValidateHeaderOffsets()
{
    // Check magic number
    if (pcHeader->IDENT != AI_MD3_MAGIC_NUMBER_BE &&
        pcHeader->IDENT != AI_MD3_MAGIC_NUMBER_LE)
            throw DeadlyImportError( "Invalid MD3 file: Magic bytes not found");

    // Check file format version
    if (pcHeader->VERSION > 15)
        ASSIMP_LOG_WARN( "Unsupported MD3 file version. Continuing happily ...");

    // Check some offset values whether they are valid
    if (!pcHeader->NUM_SURFACES)
        throw DeadlyImportError( "Invalid md3 file: NUM_SURFACES is 0");

    if (pcHeader->OFS_FRAMES >= fileSize || pcHeader->OFS_SURFACES >= fileSize ||
        pcHeader->OFS_EOF > fileSize) {
        throw DeadlyImportError("Invalid MD3 header: some offsets are outside the file");
    }

	if (pcHeader->NUM_SURFACES > AI_MAX_ALLOC(MD3::Surface)) {
        throw DeadlyImportError("Invalid MD3 header: too many surfaces, would overflow");
	}

    if (pcHeader->OFS_SURFACES + pcHeader->NUM_SURFACES * sizeof(MD3::Surface) >= fileSize) {
        throw DeadlyImportError("Invalid MD3 header: some surfaces are outside the file");
    }

    if (pcHeader->NUM_FRAMES <= configFrameID )
        throw DeadlyImportError("The requested frame is not existing the file");
}